

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O2

TSpirvRequirement * __thiscall
glslang::TParseContext::makeSpirvRequirement
          (TParseContext *this,TSourceLoc *loc,TString *name,TIntermAggregate *extensions,
          TIntermAggregate *capabilities)

{
  undefined8 *puVar1;
  long *plVar2;
  uint __line;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  TSpirvRequirement *this_00;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  char *__assertion;
  undefined8 *puVar6;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  this_00 = (TSpirvRequirement *)
            TSpirvRequirement::operator_new((TSpirvRequirement *)0x70,(size_t)loc);
  TSpirvRequirement::TSpirvRequirement(this_00);
  bVar3 = std::operator==(name,"extensions");
  if (bVar3) {
    if (extensions == (TIntermAggregate *)0x0) {
      __assertion = "extensions";
      __line = 0x41;
LAB_0042ec8c:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                    ,__line,
                    "TSpirvRequirement *glslang::TParseContext::makeSpirvRequirement(const TSourceLoc &, const TString &, const TIntermAggregate *, const TIntermAggregate *)"
                   );
    }
    iVar4 = (*(extensions->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x33])(extensions);
    puVar1 = *(undefined8 **)(CONCAT44(extraout_var,iVar4) + 0x10);
    for (puVar6 = *(undefined8 **)(CONCAT44(extraout_var,iVar4) + 8); puVar6 != puVar1;
        puVar6 = puVar6 + 1) {
      plVar2 = (long *)*puVar6;
      lVar5 = (**(code **)(*plVar2 + 0x28))(plVar2);
      if (lVar5 == 0) {
        __assertion = "extension->getAsConstantUnion()";
        __line = 0x43;
        goto LAB_0042ec8c;
      }
      lVar5 = (**(code **)(*plVar2 + 0x28))(plVar2);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
      ::
      _M_insert_unique<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&>
                ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 **(undefined8 **)(*(long *)(lVar5 + 0xc0) + 8));
    }
  }
  else {
    bVar3 = std::operator==(name,"capabilities");
    if (bVar3) {
      if (capabilities == (TIntermAggregate *)0x0) {
        __assertion = "capabilities";
        __line = 0x47;
        goto LAB_0042ec8c;
      }
      iVar4 = (*(capabilities->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x33])(capabilities);
      puVar1 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar4) + 0x10);
      for (puVar6 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar4) + 8); puVar6 != puVar1;
          puVar6 = puVar6 + 1) {
        plVar2 = (long *)*puVar6;
        lVar5 = (**(code **)(*plVar2 + 0x28))(plVar2);
        if (lVar5 == 0) {
          __assertion = "capability->getAsConstantUnion()";
          __line = 0x49;
          goto LAB_0042ec8c;
        }
        lVar5 = (**(code **)(*plVar2 + 0x28))(plVar2);
        uStack_38 = CONCAT44(**(undefined4 **)(*(long *)(lVar5 + 0xc0) + 8),(undefined4)uStack_38);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_glslang::pool_allocator<int>_>
        ::_M_insert_unique<int>
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_glslang::pool_allocator<int>_>
                    *)&this_00->capabilities,(int *)((long)&uStack_38 + 4));
      }
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"unknown SPIR-V requirement",(name->_M_dataplus)._M_p,"");
    }
  }
  return this_00;
}

Assistant:

TSpirvRequirement* TParseContext::makeSpirvRequirement(const TSourceLoc& loc, const TString& name,
                                                       const TIntermAggregate* extensions,
                                                       const TIntermAggregate* capabilities)
{
    TSpirvRequirement* spirvReq = new TSpirvRequirement;

    if (name == "extensions") {
        assert(extensions);
        for (auto extension : extensions->getSequence()) {
            assert(extension->getAsConstantUnion());
            spirvReq->extensions.insert(*extension->getAsConstantUnion()->getConstArray()[0].getSConst());
        }
    } else if (name == "capabilities") {
        assert(capabilities);
        for (auto capability : capabilities->getSequence()) {
            assert(capability->getAsConstantUnion());
            spirvReq->capabilities.insert(capability->getAsConstantUnion()->getConstArray()[0].getIConst());
        }
    } else
        error(loc, "unknown SPIR-V requirement", name.c_str(), "");

    return spirvReq;
}